

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_validate(JSON_Value *schema,JSON_Value *value)

{
  JSON_Value_Type JVar1;
  JSON_Value_Type JVar2;
  JSON_Status JVar3;
  JSON_Array *pJVar4;
  JSON_Array *array;
  JSON_Value *pJVar5;
  size_t sVar6;
  JSON_Object *pJVar7;
  JSON_Object *pJVar8;
  JSON_Value *pJVar9;
  JSON_Value *value_00;
  JSON_Value *in_RSI;
  JSON_Value *in_RDI;
  size_t count;
  size_t i;
  char *key;
  JSON_Value_Type value_type;
  JSON_Value_Type schema_type;
  JSON_Object *value_object;
  JSON_Object *schema_object;
  JSON_Array *value_array;
  JSON_Array *schema_array;
  JSON_Value *temp_value;
  JSON_Value *temp_schema_value;
  JSON_Object *local_60;
  JSON_Status local_4;
  
  if ((in_RDI == (JSON_Value *)0x0) || (in_RSI == (JSON_Value *)0x0)) {
    local_4 = -1;
  }
  else {
    JVar1 = json_value_get_type(in_RDI);
    JVar2 = json_value_get_type(in_RSI);
    if ((JVar1 == JVar2) || (JVar1 == 1)) {
      value_00 = (JSON_Value *)(ulong)(JVar1 + 1);
      switch(value_00) {
      case (JSON_Value *)0x0:
      default:
        local_4 = -1;
        break;
      case (JSON_Value *)0x2:
      case (JSON_Value *)0x3:
      case (JSON_Value *)0x4:
      case (JSON_Value *)0x7:
        local_4 = 0;
        break;
      case (JSON_Value *)0x5:
        pJVar7 = json_value_get_object(value_00);
        pJVar8 = json_value_get_object(value_00);
        pJVar7 = (JSON_Object *)json_object_get_count(pJVar7);
        if (pJVar7 == (JSON_Object *)0x0) {
          local_4 = 0;
        }
        else {
          pJVar8 = (JSON_Object *)json_object_get_count(pJVar8);
          if (pJVar8 < pJVar7) {
            local_4 = -1;
          }
          else {
            for (local_60 = (JSON_Object *)0x0; local_60 < pJVar7;
                local_60 = (JSON_Object *)((long)&local_60->wrapping_value + 1)) {
              json_object_get_name(pJVar7,(size_t)value_00);
              pJVar5 = json_object_get_value(pJVar7,(char *)value_00);
              pJVar9 = json_object_get_value(pJVar7,(char *)value_00);
              if (pJVar9 == (JSON_Value *)0x0) {
                return -1;
              }
              JVar3 = json_validate(in_RSI,pJVar5);
              if (JVar3 != 0) {
                return -1;
              }
            }
            local_4 = 0;
          }
        }
        break;
      case (JSON_Value *)0x6:
        pJVar4 = json_value_get_array(value_00);
        array = json_value_get_array(value_00);
        pJVar4 = (JSON_Array *)json_array_get_count(pJVar4);
        if (pJVar4 == (JSON_Array *)0x0) {
          local_4 = 0;
        }
        else {
          pJVar5 = json_array_get_value(pJVar4,(size_t)value_00);
          for (local_60 = (JSON_Object *)0x0; sVar6 = json_array_get_count(array), local_60 < sVar6;
              local_60 = (JSON_Object *)((long)local_60 + 1)) {
            json_array_get_value(pJVar4,(size_t)value_00);
            JVar3 = json_validate(in_RSI,pJVar5);
            if (JVar3 != 0) {
              return -1;
            }
          }
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

JSON_Status json_validate(const JSON_Value *schema, const JSON_Value *value) {
    JSON_Value *temp_schema_value = NULL, *temp_value = NULL;
    JSON_Array *schema_array = NULL, *value_array = NULL;
    JSON_Object *schema_object = NULL, *value_object = NULL;
    JSON_Value_Type schema_type = JSONError, value_type = JSONError;
    const char *key = NULL;
    size_t i = 0, count = 0;
    if (schema == NULL || value == NULL) {
        return JSONFailure;
    }
    schema_type = json_value_get_type(schema);
    value_type = json_value_get_type(value);
    if (schema_type != value_type && schema_type != JSONNull) { /* null represents all values */
        return JSONFailure;
    }
    switch (schema_type) {
        case JSONArray:
            schema_array = json_value_get_array(schema);
            value_array = json_value_get_array(value);
            count = json_array_get_count(schema_array);
            if (count == 0) {
                return JSONSuccess; /* Empty array allows all types */
            }
            /* Get first value from array, rest is ignored */
            temp_schema_value = json_array_get_value(schema_array, 0);
            for (i = 0; i < json_array_get_count(value_array); i++) {
                temp_value = json_array_get_value(value_array, i);
                if (json_validate(temp_schema_value, temp_value) != JSONSuccess) {
                    return JSONFailure;
                }
            }
            return JSONSuccess;
        case JSONObject:
            schema_object = json_value_get_object(schema);
            value_object = json_value_get_object(value);
            count = json_object_get_count(schema_object);
            if (count == 0) {
                return JSONSuccess; /* Empty object allows all objects */
            } else if (json_object_get_count(value_object) < count) {
                return JSONFailure; /* Tested object mustn't have less name-value pairs than schema */
            }
            for (i = 0; i < count; i++) {
                key = json_object_get_name(schema_object, i);
                temp_schema_value = json_object_get_value(schema_object, key);
                temp_value = json_object_get_value(value_object, key);
                if (temp_value == NULL) {
                    return JSONFailure;
                }
                if (json_validate(temp_schema_value, temp_value) != JSONSuccess) {
                    return JSONFailure;
                }
            }
            return JSONSuccess;
        case JSONString: case JSONNumber: case JSONBoolean: case JSONNull:
            return JSONSuccess; /* equality already tested before switch */
        case JSONError: default:
            return JSONFailure;
    }
}